

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O1

ErrorNumber freeLib(void)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  
  TVar1 = TA_Shutdown();
  if (TVar1 == TA_SUCCESS) {
    EVar2 = TA_TEST_PASS;
  }
  else {
    printf("TA_Shutdown failed [%d]\n",(ulong)TVar1);
    EVar2 = TA_TESTUTIL_SHUTDOWN_FAILED;
  }
  return EVar2;
}

Assistant:

ErrorNumber freeLib()
{
   TA_RetCode retCode;

   /* For testing purpose */
   /* TA_FATAL_RET( "Test again", 100, 200, 0 ); */

   retCode = TA_Shutdown();
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_Shutdown failed [%d]\n", retCode );
      return TA_TESTUTIL_SHUTDOWN_FAILED;
   }

   return TA_TEST_PASS;
}